

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtipccommon_p.h
# Opt level: O0

int QtIpcCommon::createUnixKeyFile(QByteArray *fileName)

{
  int __fd;
  int *piVar1;
  char *in_RDI;
  int fd;
  mode_t in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 local_4;
  
  QByteArray::constData((QByteArray *)0x8d4557);
  __fd = qt_safe_open(in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  if (__fd < 0) {
    piVar1 = __errno_location();
    if (*piVar1 == 0x11) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    close(__fd);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

inline int createUnixKeyFile(const QByteArray &fileName)
{
    int fd = qt_safe_open(fileName.constData(), O_EXCL | O_CREAT | O_RDWR, 0640);
    if (fd < 0) {
        if (errno == EEXIST)
            return 0;
        return -1;
    } else {
        close(fd);
    }
    return 1;

}